

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_pack1to4_int8.h
# Opt level: O0

void ncnn::convolution_pack1to4_int8_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *weight_data_int8,int kernel_w,int kernel_h,
               int dilation_w,int dilation_h,int stride_w,int stride_h,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int *piVar4;
  int in_ECX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  __m128i _s0;
  __m128i _sh;
  __m128i _sl;
  __m128i _w;
  __m128i _val;
  int k;
  char *sptr;
  Mat m;
  int q;
  char *kptr;
  __m128i _sum0;
  int j_1;
  int i_1;
  int *outptr;
  int p;
  int j;
  int i;
  int gap;
  int p2;
  int p1;
  int *space_ofs;
  vector<int,_std::allocator<int>_> _space_ofs;
  int maxk;
  int outch;
  int outh;
  int outw;
  int channels;
  int w;
  allocator_type *in_stack_fffffffffffffc80;
  size_type in_stack_fffffffffffffc88;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffc90;
  Mat *in_stack_fffffffffffffc98;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  int local_2f4;
  Mat local_2e8;
  int local_29c;
  Mat local_298;
  Mat *local_250;
  undefined1 local_248 [16];
  int local_230;
  int local_22c;
  Mat local_228;
  int *local_1e0;
  int local_1d8;
  int local_1d4;
  int local_1d0;
  int local_1cc;
  int local_1c8;
  int local_1c4;
  reference local_1c0;
  vector<int,_std::allocator<int>_> local_1a0;
  int local_184;
  int local_180;
  int local_17c;
  int local_178;
  int local_174;
  int local_170;
  int local_16c;
  int local_168;
  int local_164;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  int *local_110;
  undefined1 local_108 [16];
  undefined8 local_f8;
  undefined8 uStack_f0;
  void *local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  ulong uStack_d0;
  undefined1 local_c8 [16];
  void *local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  allocator_type *paStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  allocator_type *paStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  void *local_48;
  undefined8 uStack_40;
  Mat *local_38;
  ushort local_2a;
  undefined1 local_28 [24];
  ushort local_10;
  ushort local_e;
  ushort local_c;
  ushort local_a;
  ushort local_8;
  ushort local_6;
  ushort local_4;
  ushort local_2;
  
  local_170 = *(int *)(in_RDI + 0x2c);
  local_174 = *(int *)(in_RDI + 0x38);
  local_178 = *(int *)(in_RSI + 0x2c);
  local_17c = *(int *)(in_RSI + 0x30);
  local_180 = *(int *)(in_RSI + 0x38);
  local_184 = in_ECX * in_R8D;
  local_16c = in_R9D;
  local_168 = in_R8D;
  local_164 = in_ECX;
  std::allocator<int>::allocator((allocator<int> *)0x362f54);
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
  std::allocator<int>::~allocator((allocator<int> *)0x362f7a);
  local_1c0 = std::vector<int,_std::allocator<int>_>::operator[](&local_1a0,0);
  local_1c4 = 0;
  local_1c8 = 0;
  local_1cc = local_170 * in_stack_00000008 - local_164 * local_16c;
  for (local_1d0 = 0; local_1d0 < local_168; local_1d0 = local_1d0 + 1) {
    for (local_1d4 = 0; local_1d4 < local_164; local_1d4 = local_1d4 + 1) {
      local_1c0[local_1c4] = local_1c8;
      local_1c4 = local_1c4 + 1;
      local_1c8 = local_16c + local_1c8;
    }
    local_1c8 = local_1cc + local_1c8;
  }
  for (local_1d8 = 0; local_1d8 < local_180; local_1d8 = local_1d8 + 1) {
    Mat::channel(in_stack_fffffffffffffc98,(int)((ulong)in_stack_fffffffffffffc90 >> 0x20));
    piVar4 = Mat::operator_cast_to_int_(&local_228);
    Mat::~Mat((Mat *)0x36310a);
    local_1e0 = piVar4;
    for (local_22c = 0; local_22c < local_17c; local_22c = local_22c + 1) {
      for (local_230 = 0; local_230 < local_178; local_230 = local_230 + 1) {
        local_f8 = 0;
        uStack_f0 = 0;
        local_248 = ZEXT816(0);
        Mat::channel(in_stack_fffffffffffffc98,(int)((ulong)in_stack_fffffffffffffc90 >> 0x20));
        in_stack_fffffffffffffc98 = (Mat *)Mat::operator_cast_to_signed_char_(&local_298);
        Mat::~Mat((Mat *)0x3631b1);
        local_250 = in_stack_fffffffffffffc98;
        for (local_29c = 0; local_29c < local_174; local_29c = local_29c + 1) {
          Mat::channel(in_stack_fffffffffffffc98,(int)((ulong)in_stack_fffffffffffffc90 >> 0x20));
          in_stack_fffffffffffffc90 =
               (vector<int,_std::allocator<int>_> *)
               Mat::row<signed_char_const>(&local_2e8,local_22c * in_stack_00000018);
          for (local_2f4 = 0; local_2f4 < local_184; local_2f4 = local_2f4 + 1) {
            local_2a = (ushort)*(char *)((long)&(in_stack_fffffffffffffc90->
                                                super__Vector_base<int,_std::allocator<int>_>).
                                                _M_impl.super__Vector_impl_data._M_start +
                                        (long)local_1c0[local_2f4] +
                                        (long)(local_230 * in_stack_00000010));
            auVar1 = vpinsrw_avx(ZEXT216(local_2a),(uint)local_2a,1);
            auVar1 = vpinsrw_avx(auVar1,(uint)local_2a,2);
            auVar1 = vpinsrw_avx(auVar1,(uint)local_2a,3);
            auVar1 = vpinsrw_avx(auVar1,(uint)local_2a,4);
            auVar1 = vpinsrw_avx(auVar1,(uint)local_2a,5);
            auVar1 = vpinsrw_avx(auVar1,(uint)local_2a,6);
            local_28._0_16_ = vpinsrw_avx(auVar1,(uint)local_2a,7);
            local_38 = local_250;
            local_e8 = local_250->data;
            uStack_40 = 0;
            uStack_b0 = 0;
            local_d8 = 0;
            local_108._8_8_ = SUB168(ZEXT816(0),4);
            uStack_d0 = local_108._8_8_;
            uStack_e0 = 0;
            auVar3._8_8_ = 0;
            auVar3._0_8_ = local_108._8_8_;
            auVar1._8_8_ = 0;
            auVar1._0_8_ = local_e8;
            local_c8 = vpcmpgtb_avx(auVar3 << 0x40,auVar1);
            auVar2._8_8_ = 0;
            auVar2._0_8_ = local_e8;
            auVar1 = vpunpcklbw_avx(auVar2,local_c8);
            local_98 = local_28._0_8_;
            paStack_90 = (allocator_type *)local_28._8_8_;
            local_318 = auVar1._0_8_;
            local_a8 = local_318;
            uStack_310 = auVar1._8_8_;
            uStack_a0 = uStack_310;
            auVar2 = vpmullw_avx(local_28._0_16_,auVar1);
            local_78 = local_28._0_8_;
            paStack_70 = (allocator_type *)local_28._8_8_;
            local_88 = local_318;
            uStack_80 = uStack_310;
            auVar1 = vpmulhw_avx(local_28._0_16_,auVar1);
            local_328 = auVar2._0_8_;
            local_58 = local_328;
            uStack_320 = auVar2._8_8_;
            uStack_50 = uStack_320;
            local_338 = auVar1._0_8_;
            local_68 = local_338;
            uStack_330 = auVar1._8_8_;
            uStack_60 = uStack_330;
            auVar1 = vpunpcklwd_avx(auVar2,auVar1);
            local_138 = local_248._0_8_;
            uStack_130 = local_248._8_8_;
            local_348 = auVar1._0_8_;
            local_148 = local_348;
            uStack_340 = auVar1._8_8_;
            uStack_140 = uStack_340;
            local_248 = vpaddd_avx(local_248,auVar1);
            local_250 = (Mat *)((long)&local_250->data + 4);
            in_stack_fffffffffffffc80 = (allocator_type *)local_28._8_8_;
            local_108 = ZEXT816(0) << 0x20;
            local_b8 = local_e8;
            local_48 = local_e8;
            local_10 = local_2a;
            local_e = local_2a;
            local_c = local_2a;
            local_a = local_2a;
            local_8 = local_2a;
            local_6 = local_2a;
            local_4 = local_2a;
            local_2 = local_2a;
          }
          Mat::~Mat((Mat *)0x36358c);
        }
        local_110 = local_1e0 + (local_230 << 2);
        local_128 = local_248._0_8_;
        uStack_120 = local_248._8_8_;
        *(undefined8 *)local_110 = local_248._0_8_;
        *(undefined8 *)(local_110 + 2) = local_248._8_8_;
      }
      local_1e0 = local_1e0 + (local_178 << 2);
    }
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc80);
  return;
}

Assistant:

static void convolution_pack1to4_int8_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data_int8, int kernel_w, int kernel_h, int dilation_w, int dilation_h, int stride_w, int stride_h, const Option& opt)
{
    int w = bottom_blob.w;
    int channels = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        int* outptr = top_blob.channel(p);

        for (int i = 0; i < outh; i++)
        {
            for (int j = 0; j < outw; j++)
            {
                __m128i _sum0 = _mm_setzero_si128();

                const signed char* kptr = weight_data_int8.channel(p);

                // channels
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob.channel(q);
                    const signed char* sptr = m.row<const signed char>(i * stride_h) + j * stride_w;

                    for (int k = 0; k < maxk; k++)
                    {
                        __m128i _val = _mm_set1_epi16((short)sptr[space_ofs[k]]);

                        // TODO use _mm_cvtepi8_epi16 on sse4.1
                        __m128i _w = _mm_loadl_epi64((const __m128i*)kptr);
                        _w = _mm_unpacklo_epi8(_w, _mm_cmpgt_epi8(_mm_setzero_si128(), _w));

                        __m128i _sl = _mm_mullo_epi16(_val, _w);
                        __m128i _sh = _mm_mulhi_epi16(_val, _w);
                        __m128i _s0 = _mm_unpacklo_epi16(_sl, _sh);

                        _sum0 = _mm_add_epi32(_sum0, _s0);

                        kptr += 4;
                    }
                }

                _mm_storeu_si128((__m128i*)(outptr + j * 4), _sum0);
            }

            outptr += outw * 4;
        }
    }
}